

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O2

void mazexy(level *lev,coord *cc)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char cVar5;
  int iVar6;
  
  iVar4 = 100;
  do {
    iVar2 = rn2((x_maze_max >> 1) + -1);
    cc->x = (char)iVar2 * '\x02' + '\x03';
    iVar2 = rn2((y_maze_max >> 1) + -1);
    cVar1 = (char)iVar2 * '\x02' + '\x03';
    cc->y = cVar1;
    iVar4 = iVar4 + -1;
    if (iVar4 == 0) {
      iVar4 = y_maze_max >> 1;
      if (y_maze_max >> 1 < 2) {
        iVar4 = 1;
      }
      iVar2 = x_maze_max >> 1;
      if (x_maze_max >> 1 < 2) {
        iVar2 = 1;
      }
      iVar3 = 0;
      do {
        if (iVar3 == iVar2 + -1) {
          panic("mazexy: can\'t find a place!");
        }
        cVar1 = (char)iVar3 * '\x02' + '\x03';
        iVar6 = 0;
        while (iVar4 * 2 != iVar6 + 2) {
          cc->x = cVar1;
          cVar5 = (char)iVar6 + '\x03';
          cc->y = cVar5;
          iVar6 = iVar6 + 2;
          if (lev->locations[cVar1][cVar5].typ == '\x19') {
            return;
          }
        }
        iVar3 = iVar3 + 1;
      } while( true );
    }
  } while (lev->locations[cc->x][cVar1].typ != '\x19');
  return;
}

Assistant:

void mazexy(struct level *lev, coord *cc)
{
	int cpt=0;

	do {
	    cc->x = 3 + 2*rn2((x_maze_max>>1) - 1);
	    cc->y = 3 + 2*rn2((y_maze_max>>1) - 1);
	    cpt++;
	} while (cpt < 100 && lev->locations[cc->x][cc->y].typ != ROOM);
	if (cpt >= 100) {
		int x, y;
		/* last try */
		for (x = 0; x < (x_maze_max>>1) - 1; x++)
		    for (y = 0; y < (y_maze_max>>1) - 1; y++) {
			cc->x = 3 + 2 * x;
			cc->y = 3 + 2 * y;
			if (lev->locations[cc->x][cc->y].typ == ROOM)
			    return;
		    }
		panic("mazexy: can't find a place!");
	}
	return;
}